

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseDecodingSynapse.cpp
# Opt level: O0

void __thiscall TemporalPhaseDecodingSynapse::resetOutput(TemporalPhaseDecodingSynapse *this)

{
  size_type sVar1;
  reference ppEVar2;
  long in_RDI;
  int i;
  int local_c;
  
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<Event_*,_std::allocator<Event_*>_>::size
                      ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60));
    if (sVar1 <= (ulong)(long)local_c) break;
    ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                        ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),(long)local_c)
    ;
    if (*ppEVar2 != (value_type)0x0) {
      ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                           (long)local_c);
      if (*ppEVar2 != (value_type)0x0) {
        (*(*ppEVar2)->_vptr_Event[2])();
      }
      ppEVar2 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),
                           (long)local_c);
      *ppEVar2 = (value_type)0x0;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void TemporalPhaseDecodingSynapse::resetOutput() {
    for(int i = 0; i < output.size(); i++) {
        if(output[i]) {
            delete output[i];
            output[i] = NULL;
        }
    }
}